

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::addTexture
          (SRGBTestCase *this,TextureType targetType,int width,int height,Vec4 *color,WrapMode wrapS
          ,WrapMode wrapT,FilterMode minFilter,FilterMode magFilter,SRGBDecode decoding)

{
  pointer *pppSVar1;
  Context *pCVar2;
  TextureFormat texFormat;
  RenderContext *context;
  pointer __src;
  undefined8 uVar3;
  undefined8 uVar4;
  deUint32 sizedFormat;
  int iVar5;
  SRGBTestTexture *pSVar6;
  undefined4 extraout_var;
  ulong uVar7;
  pointer ppSVar8;
  int iVar9;
  int y;
  ulong uVar10;
  undefined4 in_register_00000034;
  ulong uVar11;
  int iVar12;
  size_t __n;
  
  pSVar6 = (SRGBTestTexture *)operator_new(0xb8);
  pCVar2 = (this->super_TestCase).m_context;
  texFormat = this->m_internalFormat;
  uVar3 = *(undefined8 *)CONCAT44(in_register_00000034,targetType);
  uVar4 = ((undefined8 *)CONCAT44(in_register_00000034,targetType))[1];
  pSVar6->m_context = pCVar2;
  context = pCVar2->m_renderCtx;
  sizedFormat = glu::getInternalFormat(texFormat);
  glu::Texture2D::Texture2D(&pSVar6->m_source,context,sizedFormat,0x80,0x80);
  pSVar6->m_targetType = TEXTURETYPE_2D;
  pSVar6->m_internalFormat = texFormat;
  pSVar6->m_width = 0x80;
  pSVar6->m_height = 0x80;
  *(undefined8 *)(pSVar6->m_color).m_data = uVar3;
  *(undefined8 *)((pSVar6->m_color).m_data + 2) = uVar4;
  pSVar6->m_wrapS = MIRRORED_REPEAT_GL;
  pSVar6->m_wrapT = MIRRORED_REPEAT_GL;
  pSVar6->m_minFilter = LINEAR;
  pSVar6->m_magFilter = LINEAR;
  pSVar6->m_decoding = width;
  pSVar6->m_hasSampler = false;
  iVar5 = (*pSVar6->m_context->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar5) + 0xb8))
            (-(uint)(pSVar6->m_targetType != TEXTURETYPE_2D) | 0xde1);
  tcu::Texture2D::allocLevel(&(pSVar6->m_source).m_refTexture,0);
  iVar12 = pSVar6->m_height;
  if (0 < iVar12) {
    iVar9 = pSVar6->m_width;
    y = 0;
    do {
      if (0 < iVar9) {
        iVar12 = 0;
        do {
          tcu::PixelBufferAccess::setPixel
                    ((pSVar6->m_source).m_refTexture.super_TextureLevelPyramid.m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start,&pSVar6->m_color,iVar12,y,0);
          iVar12 = iVar12 + 1;
          iVar9 = pSVar6->m_width;
        } while (iVar12 < iVar9);
        iVar12 = pSVar6->m_height;
      }
      y = y + 1;
    } while (y < iVar12);
  }
  (**(code **)(CONCAT44(extraout_var,iVar5) + 0xb8))
            (-(uint)(pSVar6->m_targetType != TEXTURETYPE_2D) | 0xde1,0);
  ppSVar8 = (this->m_textureSourceList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar8 ==
      (this->m_textureSourceList).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __src = (this->m_textureSourceList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)ppSVar8 - (long)__src;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar11 = (long)__n >> 3;
    uVar7 = 1;
    if (ppSVar8 != __src) {
      uVar7 = uVar11;
    }
    uVar10 = uVar7 + uVar11;
    if (0xffffffffffffffe < uVar10) {
      uVar10 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar7,uVar11)) {
      uVar10 = 0xfffffffffffffff;
    }
    if (uVar10 == 0) {
      ppSVar8 = (pointer)0x0;
    }
    else {
      ppSVar8 = (pointer)operator_new(uVar10 * 8);
    }
    ppSVar8[uVar11] = pSVar6;
    if (0 < (long)__n) {
      memmove(ppSVar8,__src,__n);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src,(long)(this->m_textureSourceList).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
    }
    (this->m_textureSourceList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppSVar8;
    (this->m_textureSourceList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppSVar8 + __n + 8);
    (this->m_textureSourceList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppSVar8 + uVar10;
  }
  else {
    *ppSVar8 = pSVar6;
    pppSVar1 = &(this->m_textureSourceList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return;
}

Assistant:

void SRGBTestCase::addTexture (	const glu::TextureTestUtil::TextureType	targetType,
								const int								width,
								const int								height,
								const tcu::Vec4							color,
								const tcu::Sampler::WrapMode			wrapS,
								const tcu::Sampler::WrapMode			wrapT,
								const tcu::Sampler::FilterMode			minFilter,
								const tcu::Sampler::FilterMode			magFilter,
								const SRGBDecode						decoding)
{
	SRGBTestTexture* texture = new SRGBTestTexture(m_context, targetType, m_internalFormat, width, height, color, wrapS, wrapT, minFilter, magFilter, decoding);
	m_textureSourceList.push_back(texture);
}